

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O3

void __thiscall hanabi_learning_env::HanabiState::AdvanceToNextPlayer(HanabiState *this)

{
  int iVar1;
  
  if (((this->deck_).total_count_ != 0) && (iVar1 = PlayerToDeal(this), -1 < iVar1)) {
    this->cur_player_ = -1;
    return;
  }
  this->cur_player_ = this->next_non_chance_player_;
  this->next_non_chance_player_ =
       (int)(((long)this->next_non_chance_player_ + 1U) %
            (ulong)(((long)(this->hands_).
                           super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->hands_).
                           super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555));
  return;
}

Assistant:

void HanabiState::AdvanceToNextPlayer() {
  if (!deck_.Empty() && PlayerToDeal() >= 0) {
    cur_player_ = kChancePlayerId;
  } else {
    cur_player_ = next_non_chance_player_;
    next_non_chance_player_ = (cur_player_ + 1) % hands_.size();
  }
}